

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

obj * o_material(obj *obj,uint material)

{
  objclass *poVar1;
  obj *poVar2;
  obj *obj_00;
  
  poVar1 = objects;
  if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) != 0xf0) {
    for (obj_00 = obj->cobj; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
      if ((*(ushort *)&poVar1[obj_00->otyp].field_0x11 & 0x1f0) == 0xf0) {
        return obj_00;
      }
      if ((obj_00->cobj != (obj *)0x0) &&
         (poVar2 = o_material(obj_00,material), poVar2 != (obj *)0x0)) {
        return poVar2;
      }
    }
    obj = (obj *)0x0;
  }
  return obj;
}

Assistant:

static struct obj *o_material(struct obj *obj, unsigned material)
{
    struct obj* otmp;
    struct obj *temp;

    if (objects[obj->otyp].oc_material == material) return obj;

    if (Has_contents(obj)) {
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj)
	    if (objects[otmp->otyp].oc_material == material) return otmp;
	    else if (Has_contents(otmp) && (temp = o_material(otmp, material)))
		return temp;
    }
    return NULL;
}